

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

optional<pbrt::SquareMatrix<2>_> *
pbrt::Inverse<2>(optional<pbrt::SquareMatrix<2>_> *__return_storage_ptr__,SquareMatrix<2> *m)

{
  Float FVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool bVar4;
  int j;
  int *piVar5;
  Float *pFVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Float minv [2] [2];
  int ipiv [2];
  int indxr [2];
  int indxc [2];
  Float local_58 [2];
  Float aFStack_50 [2];
  int local_48 [6];
  
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  piVar9 = local_48 + 4;
  piVar10 = local_48 + 2;
  local_48[0] = 0;
  local_48[1] = 0;
  local_58 = m->m[0];
  aFStack_50 = m->m[1];
  bVar17 = true;
  while( true ) {
    auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar12 = 0;
    lVar16 = 0;
    lVar11 = 0;
    piVar5 = local_48;
    bVar4 = true;
    do {
      bVar14 = bVar4;
      if (*piVar5 != 1) {
        lVar7 = 0;
        piVar5 = local_48;
        bVar4 = true;
        do {
          bVar13 = bVar4;
          if (*piVar5 == 0) {
            auVar20 = vandps_avx(ZEXT416((uint)local_58[lVar12 * 2 + lVar7]),auVar18);
            if (auVar22._0_4_ <= auVar20._0_4_) {
              auVar22 = ZEXT1664(auVar20);
              lVar11 = lVar12;
              lVar16 = lVar7;
            }
          }
          else if (1 < *piVar5) goto LAB_002feb8f;
          lVar7 = 1;
          piVar5 = local_48 + 1;
          bVar4 = false;
        } while (bVar13);
      }
      lVar12 = 1;
      piVar5 = local_48 + 1;
      bVar4 = false;
    } while (bVar14);
    iVar15 = (int)lVar16;
    lVar12 = (long)iVar15;
    local_48[lVar12] = local_48[lVar12] + 1;
    iVar8 = (int)lVar11;
    if (iVar8 != iVar15) {
      uVar2 = *(undefined8 *)(local_58 + (long)iVar8 * 2);
      *(undefined8 *)(local_58 + (long)iVar8 * 2) = *(undefined8 *)(local_58 + lVar12 * 2);
      *(undefined8 *)(local_58 + lVar12 * 2) = uVar2;
    }
    *piVar10 = iVar8;
    *piVar9 = iVar15;
    fVar19 = local_58[lVar12 * 3];
    if ((fVar19 == 0.0) && (!NAN(fVar19))) break;
    fVar19 = 1.0 / fVar19;
    lVar11 = 0;
    local_58[lVar12 * 3] = 1.0;
    auVar20._0_4_ = fVar19 * (float)*(undefined8 *)(local_58 + lVar12 * 2);
    auVar20._4_4_ = fVar19 * (float)((ulong)*(undefined8 *)(local_58 + lVar12 * 2) >> 0x20);
    auVar20._8_4_ = fVar19 * 0.0;
    auVar20._12_4_ = fVar19 * 0.0;
    uVar2 = vmovlps_avx(auVar20);
    *(undefined8 *)(local_58 + lVar12 * 2) = uVar2;
    pFVar6 = local_58;
    bVar4 = true;
    do {
      bVar14 = bVar4;
      if (lVar11 != lVar16) {
        FVar1 = local_58[lVar11 * 2 + lVar12];
        auVar21._4_4_ = FVar1;
        auVar21._0_4_ = FVar1;
        auVar21._8_4_ = FVar1;
        auVar21._12_4_ = FVar1;
        local_58[lVar11 * 2 + lVar12] = 0.0;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(local_58 + lVar12 * 2);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)pFVar6;
        auVar20 = vfnmadd231ps_fma(auVar24,auVar21,auVar23);
        uVar3 = vmovlps_avx(auVar20);
        *(ulong *)pFVar6 = uVar3;
      }
      lVar11 = 1;
      pFVar6 = aFStack_50;
      bVar4 = false;
    } while (bVar14);
    piVar10 = local_48 + 3;
    piVar9 = local_48 + 5;
    bVar4 = !bVar17;
    bVar17 = false;
    if (bVar4) {
      lVar11 = 1;
      do {
        iVar8 = local_48[lVar11 + 2];
        iVar15 = local_48[lVar11 + 4];
        if (iVar8 != iVar15) {
          FVar1 = local_58[iVar8];
          local_58[iVar8] = local_58[iVar15];
          local_58[iVar15] = FVar1;
          FVar1 = aFStack_50[iVar8];
          aFStack_50[iVar8] = aFStack_50[iVar15];
          aFStack_50[iVar15] = FVar1;
        }
        bVar17 = lVar11 != 0;
        lVar11 = lVar11 + -1;
      } while (bVar17);
      SquareMatrix<2>::SquareMatrix((SquareMatrix<2> *)__return_storage_ptr__,&local_58);
      __return_storage_ptr__->set = true;
      return __return_storage_ptr__;
    }
  }
LAB_002feb8f:
  *(undefined4 *)&__return_storage_ptr__->set = 0;
  __return_storage_ptr__->optionalValue =
       (aligned_storage_t<sizeof(pbrt::SquareMatrix<2>),_alignof(pbrt::SquareMatrix<2>)>)
       (ZEXT816(0) << 0x20);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<N>> Inverse(const SquareMatrix<N> &m) {
    int indxc[N], indxr[N];
    int ipiv[N] = {0};
    Float minv[N][N];
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            minv[i][j] = m[i][j];
    for (int i = 0; i < N; i++) {
        int irow = 0, icol = 0;
        Float big = 0.f;
        // Choose pivot
        for (int j = 0; j < N; j++) {
            if (ipiv[j] != 1) {
                for (int k = 0; k < N; k++) {
                    if (ipiv[k] == 0) {
                        if (std::abs(minv[j][k]) >= big) {
                            big = std::abs(minv[j][k]);
                            irow = j;
                            icol = k;
                        }
                    } else if (ipiv[k] > 1)
                        return {};  // singular
                }
            }
        }
        ++ipiv[icol];
        // Swap rows _irow_ and _icol_ for pivot
        if (irow != icol) {
            for (int k = 0; k < N; ++k)
                pstd::swap(minv[irow][k], minv[icol][k]);
        }
        indxr[i] = irow;
        indxc[i] = icol;
        if (minv[icol][icol] == 0.f)
            return {};  // singular

        // Set $m[icol][icol]$ to one by scaling row _icol_ appropriately
        Float pivinv = 1. / minv[icol][icol];
        minv[icol][icol] = 1.;
        for (int j = 0; j < N; j++)
            minv[icol][j] *= pivinv;

        // Subtract this row from others to zero out their columns
        for (int j = 0; j < N; j++) {
            if (j != icol) {
                Float save = minv[j][icol];
                minv[j][icol] = 0;
                for (int k = 0; k < N; k++)
                    minv[j][k] = FMA(-minv[icol][k], save, minv[j][k]);
            }
        }
    }
    // Swap columns to reflect permutation
    for (int j = N - 1; j >= 0; j--) {
        if (indxr[j] != indxc[j]) {
            for (int k = 0; k < N; k++)
                pstd::swap(minv[k][indxr[j]], minv[k][indxc[j]]);
        }
    }
    return SquareMatrix<N>(minv);
}